

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoplus.cpp
# Opt level: O0

void __thiscall EOPlus::Quest::Quest(Quest *this,istream *is)

{
  back_insert_iterator<std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_> it;
  iterator local_138;
  iterator local_118;
  undefined1 local_f8 [8];
  Parser parser;
  undefined1 local_d8 [8];
  Lexer lexer;
  undefined1 local_68 [8];
  deque<EOPlus::Token,_std::allocator<EOPlus::Token>_> tokens;
  istream *is_local;
  Quest *this_local;
  
  this->has_info = false;
  tokens.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)is;
  Info::Info(&this->info);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>_>_>
  ::map(&this->states);
  std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::deque
            ((deque<EOPlus::Token,_std::allocator<EOPlus::Token>_> *)local_68);
  Lexer::Lexer((Lexer *)local_d8,
               (istream *)
               tokens.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node);
  it = std::back_inserter<std::deque<EOPlus::Token,std::allocator<EOPlus::Token>>>
                 ((deque<EOPlus::Token,_std::allocator<EOPlus::Token>_> *)local_68);
  parser.tok._M_t.
  super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
  ._M_t.
  super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
  .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl =
       (__uniq_ptr_data<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>,_true,_true>
        )Lexer::
         Lex<std::back_insert_iterator<std::deque<EOPlus::Token,std::allocator<EOPlus::Token>>>>
                   ((Lexer *)local_d8,it);
  std::begin<std::deque<EOPlus::Token,std::allocator<EOPlus::Token>>>
            (&local_118,(deque<EOPlus::Token,_std::allocator<EOPlus::Token>_> *)local_68);
  std::end<std::deque<EOPlus::Token,std::allocator<EOPlus::Token>>>
            (&local_138,(deque<EOPlus::Token,_std::allocator<EOPlus::Token>_> *)local_68);
  Parser::Parser<std::_Deque_iterator<EOPlus::Token,EOPlus::Token&,EOPlus::Token*>>
            ((Parser *)local_f8,this,&local_118,&local_138);
  Parser::ParseGlobal((Parser *)local_f8);
  Parser::~Parser((Parser *)local_f8);
  Lexer::~Lexer((Lexer *)local_d8);
  std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::~deque
            ((deque<EOPlus::Token,_std::allocator<EOPlus::Token>_> *)local_68);
  return;
}

Assistant:

Quest::Quest(std::istream &is)
		: has_info(false)
	{
		std::deque<Token> tokens;

		Lexer lexer(is);
		lexer.Lex(std::back_inserter(tokens));

		Parser parser(*this, UTIL_RANGE(tokens));
		parser.ParseGlobal();
	}